

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O2

int lj_cf_table_concat(lua_State *L)

{
  uint uVar1;
  uint n;
  MSize MVar2;
  GCtab *t;
  GCstr *pGVar3;
  ulong uVar4;
  MSize MVar5;
  luaL_Buffer b;
  
  t = lj_lib_checktab(L,1);
  pGVar3 = lj_lib_optstr(L,2);
  if (pGVar3 == (GCstr *)0x0) {
    MVar5 = 0;
  }
  else {
    MVar5 = pGVar3->len;
  }
  n = lj_lib_optint(L,3,1);
  if ((L->base + 3 < L->top) && (*(int *)((long)L->base + 0x1c) != -1)) {
    MVar2 = lj_lib_checkint(L,4);
  }
  else {
    MVar2 = lj_tab_len(t);
  }
  b.p = b.buffer;
  b.lvl = 0;
  b.L = L;
  if ((int)n <= (int)MVar2) {
    while( true ) {
      lua_rawgeti(L,1,n);
      uVar1 = *(uint *)((long)L->top + -4);
      if (0xfffeffff < uVar1 && uVar1 != 0xfffffffb) {
        uVar4 = (ulong)~uVar1;
        if ((uVar1 & 0xffff8000) == 0xffff0000) {
          uVar4 = 3;
        }
        lj_err_callerv(L,LJ_ERR_TABCAT,lj_obj_itypename[uVar4],(ulong)n);
      }
      luaL_addvalue(&b);
      if (MVar2 == n) break;
      if (MVar5 != 0) {
        luaL_addlstring(&b,(char *)(pGVar3 + 1),(ulong)MVar5);
      }
      n = n + 1;
    }
  }
  luaL_pushresult(&b);
  return 1;
}

Assistant:

LJLIB_CF(table_concat)
{
  luaL_Buffer b;
  GCtab *t = lj_lib_checktab(L, 1);
  GCstr *sep = lj_lib_optstr(L, 2);
  MSize seplen = sep ? sep->len : 0;
  int32_t i = lj_lib_optint(L, 3, 1);
  int32_t e = (L->base+3 < L->top && !tvisnil(L->base+3)) ?
	      lj_lib_checkint(L, 4) : (int32_t)lj_tab_len(t);
  luaL_buffinit(L, &b);
  if (i <= e) {
    for (;;) {
      cTValue *o;
      lua_rawgeti(L, 1, i);
      o = L->top-1;
      if (!(tvisstr(o) || tvisnumber(o)))
	lj_err_callerv(L, LJ_ERR_TABCAT, lj_typename(o), i);
      luaL_addvalue(&b);
      if (i++ == e) break;
      if (seplen)
	luaL_addlstring(&b, strdata(sep), seplen);
    }
  }
  luaL_pushresult(&b);
  return 1;
}